

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUIElement * __thiscall
irr::gui::CGUIEnvironment::getNextElement(CGUIEnvironment *this,bool reverse,bool group)

{
  undefined1 *puVar1;
  s32 startOrder;
  IGUIElement *ret;
  IGUIElement *pIVar2;
  IGUIElement *pIVar3;
  IGUIElement *pIVar4;
  IGUIElement *first;
  IGUIElement *closest;
  
  pIVar4 = this->Focus;
  pIVar2 = pIVar4;
  if (pIVar4 == (IGUIElement *)0x0) {
    pIVar2 = (IGUIElement *)0x0;
  }
  else {
    do {
      if (pIVar2->IsTabGroup != false) break;
      pIVar2 = pIVar2->Parent;
    } while (pIVar2 != (IGUIElement *)0x0);
  }
  if (group && pIVar2 != (IGUIElement *)0x0) {
    startOrder = pIVar2->TabOrder;
    goto LAB_0021b305;
  }
  if ((pIVar4 != (IGUIElement *)0x0 && !group) && (pIVar4->IsTabGroup == false)) {
    startOrder = pIVar4->TabOrder;
    if (startOrder != -1) goto LAB_0021b305;
    if (pIVar4 != (IGUIElement *)0x0) {
      startOrder = -1;
      for (pIVar4 = pIVar4->Parent;
          (pIVar4 != (IGUIElement *)0x0 && (startOrder = pIVar4->TabOrder, startOrder == -1));
          pIVar4 = pIVar4->Parent) {
      }
      goto LAB_0021b305;
    }
  }
  startOrder = -1;
LAB_0021b305:
  puVar1 = &(this->super_IGUIEnvironment).field_0x8;
  pIVar4 = pIVar2;
  if (group) {
    pIVar4 = (IGUIElement *)puVar1;
  }
  pIVar3 = (IGUIElement *)0x0;
  if (group) {
    pIVar3 = (IGUIElement *)puVar1;
  }
  closest = (IGUIElement *)0x0;
  first = (IGUIElement *)0x0;
  if (pIVar2 == (IGUIElement *)0x0) {
    pIVar4 = (IGUIElement *)puVar1;
  }
  IGUIElement::getNextElement
            (pIVar4,startOrder,reverse,group,&first,&closest,false,(this->FocusFlags & 0x16) != 0);
  if (first != (IGUIElement *)0x0) {
    pIVar3 = first;
  }
  if (closest != (IGUIElement *)0x0) {
    pIVar3 = closest;
  }
  return pIVar3;
}

Assistant:

IGUIElement *CGUIEnvironment::getNextElement(bool reverse, bool group)
{
	// start the search at the root of the current tab group
	IGUIElement *startPos = Focus ? Focus->getTabGroup() : 0;
	s32 startOrder = -1;

	// if we're searching for a group
	if (group && startPos) {
		startOrder = startPos->getTabOrder();
	} else if (!group && Focus && !Focus->isTabGroup()) {
		startOrder = Focus->getTabOrder();
		if (startOrder == -1) {
			// this element is not part of the tab cycle,
			// but its parent might be...
			IGUIElement *el = Focus;
			while (el && el->getParent() && startOrder == -1) {
				el = el->getParent();
				startOrder = el->getTabOrder();
			}
		}
	}

	if (group || !startPos)
		startPos = this; // start at the root

	// find the element
	IGUIElement *closest = 0;
	IGUIElement *first = 0;
	startPos->getNextElement(startOrder, reverse, group, first, closest, false, (FocusFlags & EFF_CAN_FOCUS_DISABLED) != 0);

	if (closest)
		return closest; // we found an element
	else if (first)
		return first; // go to the end or the start
	else if (group)
		return this; // no group found? root group
	else
		return 0;
}